

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtptngen.cpp
# Opt level: O3

UnicodeString * __thiscall
icu_63::PatternMap::getPatternFromBasePattern
          (PatternMap *this,UnicodeString *basePattern,UBool *skeletonWasSpecified)

{
  short sVar1;
  char16_t cVar2;
  ushort uVar3;
  byte bVar4;
  char16_t *pcVar5;
  int iVar6;
  int32_t length;
  int srcStart;
  int srcLength;
  PtnElem *pPVar7;
  
  sVar1 = (basePattern->fUnion).fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    iVar6 = (basePattern->fUnion).fFields.fLength;
  }
  else {
    iVar6 = (int)sVar1 >> 5;
  }
  if (iVar6 != 0) {
    if (((int)sVar1 & 2U) == 0) {
      pcVar5 = (basePattern->fUnion).fFields.fArray;
    }
    else {
      pcVar5 = (basePattern->fUnion).fStackFields.fBuffer;
    }
    iVar6 = -0x47;
    cVar2 = *pcVar5;
    if ((ushort)(cVar2 + L'﾿') < 0x1a) {
      iVar6 = -0x41;
    }
    else if (0x19 < (ushort)(cVar2 + L'ﾟ')) {
      return (UnicodeString *)0x0;
    }
    for (pPVar7 = this->boot[iVar6 + (uint)(ushort)cVar2]; pPVar7 != (PtnElem *)0x0;
        pPVar7 = (pPVar7->next).super_LocalPointerBase<icu_63::PtnElem>.ptr) {
      sVar1 = (basePattern->fUnion).fStackFields.fLengthAndFlags;
      uVar3 = (pPVar7->basePattern).fUnion.fStackFields.fLengthAndFlags;
      if ((uVar3 & 1) == 0) {
        if ((short)uVar3 < 0) {
          iVar6 = (pPVar7->basePattern).fUnion.fFields.fLength;
        }
        else {
          iVar6 = (int)(short)uVar3 >> 5;
        }
        srcStart = 0;
        if (iVar6 < 0) {
          srcStart = iVar6;
        }
        srcLength = iVar6 - srcStart;
        if (iVar6 <= iVar6 - srcStart) {
          srcLength = iVar6;
        }
        if (iVar6 < 0) {
          srcLength = 0;
        }
        if (sVar1 < 0) {
          length = (basePattern->fUnion).fFields.fLength;
        }
        else {
          length = (int)sVar1 >> 5;
        }
        if ((uVar3 & 2) == 0) {
          pcVar5 = (pPVar7->basePattern).fUnion.fFields.fArray;
        }
        else {
          pcVar5 = (pPVar7->basePattern).fUnion.fStackFields.fBuffer;
        }
        bVar4 = icu_63::UnicodeString::doCompare(basePattern,0,length,pcVar5,srcStart,srcLength);
      }
      else {
        bVar4 = ~(byte)sVar1 & 1;
      }
      if (bVar4 == 0) {
        *skeletonWasSpecified = pPVar7->skeletonWasSpecified;
        return &pPVar7->pattern;
      }
    }
  }
  return (UnicodeString *)0x0;
}

Assistant:

const UnicodeString *
PatternMap::getPatternFromBasePattern(const UnicodeString& basePattern, UBool& skeletonWasSpecified) const { // key to search for
   PtnElem *curElem;

   if ((curElem=getHeader(basePattern.charAt(0)))==nullptr) {
       return nullptr;  // no match
   }

   do  {
       if ( basePattern.compare(curElem->basePattern)==0 ) {
          skeletonWasSpecified = curElem->skeletonWasSpecified;
          return &(curElem->pattern);
       }
       curElem = curElem->next.getAlias();
   } while (curElem != nullptr);

   return nullptr;
}